

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_IsStreamStopped(PaStream *stream)

{
  undefined4 local_14;
  PaError result;
  PaStream *stream_local;
  
  local_14 = PaUtil_ValidateStreamPointer(stream);
  if (local_14 == 0) {
    local_14 = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
  }
  return local_14;
}

Assistant:

PaError Pa_IsStreamStopped( PaStream *stream )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_IsStreamStopped" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
        result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );

    PA_LOGAPI_EXIT_PAERROR( "Pa_IsStreamStopped", result );

    return result;
}